

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O2

from_chars_result_t<char>
fast_float::from_chars_advanced<double,char>
          (char *first,char *last,double *value,parse_options_t<char> options)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  from_chars_result_t<char> fVar15;
  from_chars_result_t<char> fVar16;
  from_chars_result_t<char> fVar17;
  from_chars_result_t<char> fVar18;
  from_chars_result_t<char> fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  byte bVar23;
  int iVar24;
  ulong uVar25;
  byte *pbVar26;
  byte *pbVar27;
  byte *pbVar28;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  byte *pbVar35;
  long lVar36;
  byte *pbVar37;
  ulong uVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  from_chars_result_t<char> fVar42;
  adjusted_mantissa aVar43;
  byte local_88;
  parsed_number_string_t<char> answer;
  
  if (first == last) {
    fVar42._8_8_ = 0x16;
    fVar42.ptr = first;
    return fVar42;
  }
  answer.fraction.ptr = (char *)0x0;
  answer.fraction.length = 0;
  answer.integer.ptr = (char *)0x0;
  answer.integer.length = 0;
  answer.exponent = 0;
  answer.mantissa._0_3_ = 0;
  answer.mantissa._3_5_ = 0;
  answer.lastmatch._0_3_ = 0;
  answer.lastmatch._3_5_ = 0;
  answer.valid = false;
  answer.too_many_digits = false;
  cVar1 = *first;
  answer.negative = cVar1 == '-';
  local_88 = options.decimal_point;
  pbVar26 = (byte *)first;
  if ((answer.negative) &&
     ((pbVar26 = (byte *)(first + 1), pbVar26 == (byte *)last ||
      (*pbVar26 != local_88 && 9 < (byte)(*pbVar26 - 0x30))))) goto LAB_002c8cc2;
  sVar29 = (long)last - (long)pbVar26;
  uVar38 = 0;
  for (answer.integer.length = 0; pbVar35 = pbVar26 + answer.integer.length, pbVar35 != (byte *)last
      ; answer.integer.length = answer.integer.length + 1) {
    bVar23 = *pbVar35;
    if (9 < (byte)(bVar23 - 0x30)) {
      if (bVar23 == local_88) {
        lVar36 = (sVar29 - 1) - answer.integer.length;
        answer.fraction.ptr = (char *)(pbVar26 + answer.integer.length + 1);
        pbVar37 = (byte *)answer.fraction.ptr;
        while ((7 < lVar36 &&
               (uVar30 = *(long *)pbVar37 + 0xcfcfcfcfcfcfcfd0,
               ((*(long *)pbVar37 + 0x4646464646464646U | uVar30) & 0x8080808080808080) == 0))) {
          uVar30 = (uVar30 >> 8) + uVar30 * 10;
          uVar38 = ((uVar30 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                    (uVar30 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar38 * 100000000;
          pbVar37 = pbVar37 + 8;
          lVar36 = lVar36 + -8;
        }
        for (; (pbVar28 = (byte *)last, pbVar37 != (byte *)last &&
               (pbVar28 = pbVar37, (byte)(*pbVar37 - 0x30) < 10)); pbVar37 = pbVar37 + 1) {
          uVar38 = (ulong)(byte)(*pbVar37 - 0x30) + uVar38 * 10;
        }
        pbVar37 = pbVar26 + (answer.integer.length - (long)pbVar28) + 1;
        answer.fraction.length = (size_t)(pbVar28 + (~(ulong)pbVar26 - answer.integer.length));
        sVar29 = answer.integer.length - (long)pbVar37;
      }
      else {
        pbVar37 = (byte *)0x0;
        sVar29 = answer.integer.length;
        pbVar28 = pbVar35;
      }
      goto LAB_002c8c7e;
    }
    uVar38 = (uVar38 * 10 + (ulong)bVar23) - 0x30;
  }
  pbVar37 = (byte *)0x0;
  pbVar35 = (byte *)last;
  pbVar28 = (byte *)last;
  answer.integer.length = sVar29;
LAB_002c8c7e:
  answer.integer.ptr = (char *)pbVar26;
  if (sVar29 == 0) goto LAB_002c8cc2;
  if (((ulong)options & 1) == 0) {
LAB_002c8d34:
    lVar36 = 0;
  }
  else {
    if ((pbVar28 == (byte *)last) || ((*pbVar28 | 0x20) != 0x65)) {
joined_r0x002c8cc0:
      if (((ulong)options & 4) == 0) {
LAB_002c8cc2:
        fVar42 = detail::parse_infnan<double,char>(first,last,value);
        return fVar42;
      }
      goto LAB_002c8d34;
    }
    pbVar27 = pbVar28 + 1;
    if (pbVar27 == (byte *)last) {
LAB_002c8ce0:
      bVar40 = false;
    }
    else {
      if (*pbVar27 != 0x2d) {
        if (*pbVar27 == 0x2b) {
          pbVar27 = pbVar28 + 2;
        }
        goto LAB_002c8ce0;
      }
      pbVar27 = pbVar28 + 2;
      bVar40 = true;
    }
    if ((pbVar27 == (byte *)last) || (9 < (byte)(*pbVar27 - 0x30))) goto joined_r0x002c8cc0;
    lVar34 = 0;
    for (; (pbVar28 = (byte *)last, pbVar27 != (byte *)last &&
           (pbVar28 = pbVar27, (byte)(*pbVar27 - 0x30) < 10)); pbVar27 = pbVar27 + 1) {
      if (lVar34 < 0x10000000) {
        lVar34 = (ulong)(byte)(*pbVar27 - 0x30) + lVar34 * 10;
      }
    }
    lVar36 = -lVar34;
    if (!bVar40) {
      lVar36 = lVar34;
    }
    pbVar37 = pbVar37 + lVar36;
  }
  answer.lastmatch._0_3_ = SUB83(pbVar28,0);
  answer.lastmatch._3_5_ = (undefined5)((ulong)pbVar28 >> 0x18);
  answer.valid = true;
  pbVar27 = pbVar26;
  if ((long)sVar29 < 0x14) {
    bVar40 = false;
  }
  else {
    for (; (pbVar27 != (byte *)last && (bVar23 = *pbVar27, bVar23 == local_88 || bVar23 == 0x30));
        pbVar27 = pbVar27 + 1) {
      sVar29 = sVar29 - (bVar23 == 0x30);
    }
    if ((long)sVar29 < 0x14) {
      bVar40 = false;
    }
    else {
      answer.too_many_digits = true;
      uVar38 = 0;
      for (sVar29 = answer.integer.length; (uVar38 < 1000000000000000000 && (sVar29 != 0));
          sVar29 = sVar29 - 1) {
        uVar38 = (uVar38 * 10 + (long)(char)*pbVar26) - 0x30;
        pbVar26 = pbVar26 + 1;
      }
      pbVar37 = (byte *)answer.fraction.ptr;
      sVar29 = answer.fraction.length;
      if (uVar38 < 1000000000000000000) {
        for (; (pbVar26 = pbVar37, pbVar35 = (byte *)answer.fraction.ptr,
               uVar38 < 1000000000000000000 && (sVar29 != 0)); sVar29 = sVar29 - 1) {
          uVar38 = (uVar38 * 10 + (long)(char)*pbVar37) - 0x30;
          pbVar37 = pbVar37 + 1;
        }
      }
      pbVar37 = pbVar35 + (lVar36 - (long)pbVar26);
      bVar40 = true;
    }
  }
  answer.mantissa._0_3_ = (undefined3)uVar38;
  answer.mantissa._3_5_ = (undefined5)(uVar38 >> 0x18);
  if ((byte *)0xffffffffffffffd2 < pbVar37 + -0x17 && !bVar40) {
    if ((detail::rounds_to_nearest()::fmin + 1.0 != 1.0 - detail::rounds_to_nearest()::fmin) ||
       (NAN(detail::rounds_to_nearest()::fmin + 1.0) || NAN(1.0 - detail::rounds_to_nearest()::fmin)
       )) {
      if ((-1 < (long)pbVar37) &&
         (uVar38 <= *(ulong *)(binary_format_lookup_tables<double,void>::max_mantissa +
                              (long)pbVar37 * 8))) {
        if (uVar38 == 0) {
          if (cVar1 == '-') {
            uVar33 = 0x80000000;
          }
          else {
            uVar33 = 0;
          }
          *value = (double)((ulong)uVar33 << 0x20);
          fVar19._8_8_ = 0;
          fVar19.ptr = (char *)pbVar28;
          return fVar19;
        }
        auVar41._8_4_ = (int)(uVar38 >> 0x20);
        auVar41._0_8_ = uVar38;
        auVar41._12_4_ = 0x45300000;
        dVar14 = ((auVar41._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar38) - 4503599627370496.0)) *
                 *(double *)
                  (binary_format_lookup_tables<double,void>::powers_of_ten + (long)pbVar37 * 8);
        goto LAB_002c9021;
      }
    }
    else if (uVar38 < 0x20000000000001) {
      dVar14 = (double)(long)uVar38;
      *value = dVar14;
      if ((long)pbVar37 < 0) {
        dVar14 = dVar14 / *(double *)
                           (binary_format_lookup_tables<double,void>::powers_of_ten +
                           (long)pbVar37 * -8);
      }
      else {
        dVar14 = dVar14 * *(double *)
                           (binary_format_lookup_tables<double,void>::powers_of_ten +
                           (long)pbVar37 * 8);
      }
LAB_002c9021:
      fVar16._8_8_ = 0;
      fVar16.ptr = (char *)pbVar28;
      fVar15._8_8_ = 0;
      fVar15.ptr = (char *)pbVar28;
      *value = dVar14;
      if (cVar1 != '-') {
        return fVar15;
      }
      *value = -dVar14;
      return fVar16;
    }
  }
  uVar30 = 0;
  iVar22 = (int)pbVar37;
  if ((long)pbVar37 < -0x156) {
LAB_002c8ef5:
    aVar43.mantissa = 0;
  }
  else {
    aVar43.mantissa = 0;
    if (uVar38 != 0) {
      if (0x134 < (long)pbVar37) {
        uVar30 = 0x7ff;
        goto LAB_002c8ef5;
      }
      uVar30 = 0x3f;
      if (uVar38 != 0) {
        for (; uVar38 >> uVar30 == 0; uVar30 = uVar30 - 1) {
        }
      }
      aVar43.mantissa = uVar38 << ((byte)(uVar30 ^ 0x3f) & 0x3f);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = aVar43.mantissa;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                               (long)(iVar22 * 2 + 0x2ac) * 8);
      auVar2 = auVar2 * auVar8;
      if ((~auVar2._8_4_ & 0x1ff) == 0) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = aVar43.mantissa;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                                 (long)(iVar22 * 2 + 0x2ad) * 8);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = SUB168(auVar3 * auVar9,8);
        auVar2 = auVar2 + auVar20;
      }
      iVar24 = (((iVar22 * 0x3526a >> 0x10) - (int)(uVar30 ^ 0x3f)) - (auVar2._12_4_ >> 0x1f)) +
               0x43e;
      bVar23 = 9 - (auVar2[0xf] >> 7);
      uVar30 = auVar2._8_8_ >> (bVar23 & 0x3f);
      if (iVar24 < 1) {
        uVar33 = 1 - iVar24;
        if (0x3f < uVar33) {
          uVar30 = 0;
          goto LAB_002c8ef5;
        }
        aVar43.mantissa =
             (uVar30 >> ((byte)uVar33 & 0x3f)) +
             (ulong)((uVar30 >> ((ulong)uVar33 & 0x3f) & 1) != 0);
        uVar30 = (ulong)(aVar43.mantissa >> 0x35 != 0);
        aVar43.mantissa = aVar43.mantissa >> 1;
      }
      else {
        aVar43.mantissa = uVar30 & 0xfffffffffffffe;
        if (uVar30 << (bVar23 & 0x3f) != auVar2._8_8_ || ((uint)uVar30 & 3) != 1) {
          aVar43.mantissa = uVar30;
        }
        if (1 < auVar2._0_8_) {
          aVar43.mantissa = uVar30;
        }
        if ((byte *)0x1b < pbVar37 + 4) {
          aVar43.mantissa = uVar30;
        }
        uVar30 = (ulong)((uint)aVar43.mantissa & 1);
        bVar39 = uVar30 + aVar43.mantissa >> 0x36 != 0;
        aVar43.mantissa = (aVar43.mantissa >> 1) + (uVar30 & aVar43.mantissa) & 0x7fefffffffffffff;
        if (bVar39) {
          aVar43.mantissa = 0;
        }
        uVar32 = iVar24 + (uint)bVar39;
        uVar33 = uVar32;
        if (0x7fe < uVar32) {
          uVar33 = 0x7ff;
        }
        uVar30 = (ulong)uVar33;
        if (0x7fe < uVar32) {
          aVar43.mantissa = 0;
        }
      }
    }
  }
  if (!bVar40) goto LAB_002c92ff;
  uVar31 = uVar38 + 1;
  uVar33 = 0;
  if ((long)pbVar37 < -0x156) {
LAB_002c90f5:
    uVar25 = 0;
  }
  else {
    uVar25 = 0;
    uVar33 = 0;
    if (uVar31 != 0) {
      if (0x134 < (long)pbVar37) {
        uVar33 = 0x7ff;
        goto LAB_002c90f5;
      }
      uVar25 = 0x3f;
      if (uVar31 != 0) {
        for (; uVar31 >> uVar25 == 0; uVar25 = uVar25 - 1) {
        }
      }
      uVar31 = uVar31 << ((byte)(uVar25 ^ 0x3f) & 0x3f);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar31;
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar22 * 2 + 0x2ac) * 8);
      auVar4 = auVar4 * auVar10;
      if ((~auVar4._8_4_ & 0x1ff) == 0) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar31;
        auVar11._8_8_ = 0;
        auVar11._0_8_ =
             *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar22 * 2 + 0x2ad) * 8);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = SUB168(auVar5 * auVar11,8);
        auVar4 = auVar4 + auVar21;
      }
      iVar24 = (((iVar22 * 0x3526a >> 0x10) - (int)(uVar25 ^ 0x3f)) - (auVar4._12_4_ >> 0x1f)) +
               0x43e;
      bVar23 = 9 - (auVar4[0xf] >> 7);
      uVar31 = auVar4._8_8_ >> (bVar23 & 0x3f);
      if (iVar24 < 1) {
        uVar33 = 1 - iVar24;
        if (0x3f < uVar33) {
          uVar33 = 0;
          goto LAB_002c90f5;
        }
        uVar31 = (uVar31 >> ((byte)uVar33 & 0x3f)) +
                 (ulong)((uVar31 >> ((ulong)uVar33 & 0x3f) & 1) != 0);
        uVar25 = uVar31 >> 1;
        uVar33 = (uint)(uVar31 >> 0x35 != 0);
      }
      else {
        uVar25 = uVar31 & 0xfffffffffffffe;
        if (uVar31 << (bVar23 & 0x3f) != auVar4._8_8_ || ((uint)uVar31 & 3) != 1) {
          uVar25 = uVar31;
        }
        if (1 < auVar4._0_8_) {
          uVar25 = uVar31;
        }
        if ((byte *)0x1b < pbVar37 + 4) {
          uVar25 = uVar31;
        }
        uVar31 = (ulong)((uint)uVar25 & 1);
        bVar40 = uVar31 + uVar25 >> 0x36 != 0;
        uVar25 = (uVar25 >> 1) + (uVar31 & uVar25) & 0x7fefffffffffffff;
        if (bVar40) {
          uVar25 = 0;
        }
        uVar33 = iVar24 + (uint)bVar40;
        if (0x7fe < uVar33) {
          uVar25 = 0;
          uVar33 = 0x7ff;
        }
      }
    }
  }
  if ((aVar43.mantissa != uVar25) || ((uint)uVar30 != uVar33)) {
    answer.exponent = (int64_t)pbVar37;
    if (uVar38 == 0) {
      __assert_fail("input_num > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                    ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
    }
    uVar30 = 0x3f;
    if (uVar38 != 0) {
      for (; uVar38 >> uVar30 == 0; uVar30 = uVar30 - 1) {
      }
    }
    uVar38 = uVar38 << ((byte)(uVar30 ^ 0x3f) & 0x3f);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar38;
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar22 * 2 + 0x2ac) * 8);
    auVar6 = auVar6 * auVar12;
    lVar36 = auVar6._8_8_;
    if ((~auVar6._8_4_ & 0x1ff) == 0) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar38;
      auVar13._8_8_ = 0;
      auVar13._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar22 * 2 + 0x2ad) * 8);
      lVar36 = lVar36 + (ulong)CARRY8(SUB168(auVar7 * auVar13,8),auVar6._0_8_);
    }
    aVar43.mantissa = lVar36 << ((byte)((ulong)lVar36 >> 0x3f) ^ 1);
    iVar24 = iVar22 * 0x3526a >> 0x10;
    iVar22 = -(int)(uVar30 ^ 0x3f) - (int)(lVar36 >> 0x3f);
    uVar33 = (iVar22 + iVar24) - 0x7bcd;
    uVar30 = (ulong)uVar33;
    if (iVar22 + iVar24 < 0x7bcd) {
      aVar43.power2 = uVar33;
      aVar43._12_4_ = 0;
      aVar43 = digit_comp<double,char>(&answer,aVar43);
      uVar30 = (ulong)(uint)aVar43.power2;
      uVar38 = CONCAT53(answer.mantissa._3_5_,(undefined3)answer.mantissa);
    }
    else {
      uVar38 = 1;
    }
  }
LAB_002c92ff:
  uVar33 = 0;
  if ((int)uVar30 == 0x7ff) {
    uVar33 = 0x22;
  }
  uVar31 = 0x22;
  if ((int)uVar30 != 0) {
    uVar31 = (ulong)uVar33;
  }
  if (aVar43.mantissa != 0) {
    uVar31 = (ulong)uVar33;
  }
  fVar17._8_8_ = uVar31;
  fVar17.ptr = (char *)pbVar28;
  *value = (double)((ulong)answer.negative << 0x3f | uVar30 << 0x34 | aVar43.mantissa);
  if (uVar38 != 0) {
    return fVar17;
  }
  fVar18.ec = uVar33;
  fVar18.ptr = (char *)pbVar28;
  fVar18._12_4_ = 0;
  return fVar18;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars_advanced(UC const * first, UC const * last,
                                      T &value, parse_options_t<UC> options)  noexcept  {

  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");
  static_assert (std::is_same<UC, char>::value ||
                 std::is_same<UC, wchar_t>::value ||
                 std::is_same<UC, char16_t>::value ||
                 std::is_same<UC, char32_t>::value , "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string_t<UC> pns = parse_number_string<UC>(first, last, options);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }

  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // The implementation of the Clinger's fast path is convoluted because
  // we want round-to-nearest in all cases, irrespective of the rounding mode
  // selected on the thread.
  // We proceed optimistically, assuming that detail::rounds_to_nearest() returns
  // true.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && !pns.too_many_digits) {
    // Unfortunately, the conventional Clinger's fast path is only possible
    // when the system rounds to the nearest float.
    //
    // We expect the next branch to almost always be selected.
    // We could check it first (before the previous branch), but
    // there might be performance advantages at having the check
    // be last.
    if(!cpp20_and_in_constexpr() && detail::rounds_to_nearest())  {
      // We have that fegetround() == FE_TONEAREST.
      // Next is Clinger's fast path.
      if (pns.mantissa <=binary_format<T>::max_mantissa_fast_path()) {
        value = T(pns.mantissa);
        if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
        else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
        if (pns.negative) { value = -value; }
        return answer;
      }
    } else {
      // We do not have that fegetround() == FE_TONEAREST.
      // Next is a modified Clinger's fast path, inspired by Jakub Jelínek's proposal
      if (pns.exponent >= 0 && pns.mantissa <=binary_format<T>::max_mantissa_fast_path(pns.exponent)) {
#if defined(__clang__)
        // Clang may map 0 to -0.0 when fegetround() == FE_DOWNWARD
        if(pns.mantissa == 0) {
          value = pns.negative ? -0. : 0.;
          return answer;
        }
#endif
        value = T(pns.mantissa) * binary_format<T>::exact_power_of_ten(pns.exponent);
        if (pns.negative) { value = -value; }
        return answer;
      }
    }
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits && am.power2 >= 0) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am = compute_error<binary_format<T>>(pns.exponent, pns.mantissa);
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = digit_comp<T>(pns, am); }
  to_float(pns.negative, am, value);
  // Test for over/underflow.
  if ((pns.mantissa != 0 && am.mantissa == 0 && am.power2 == 0) || am.power2 == binary_format<T>::infinite_power()) {
    answer.ec = std::errc::result_out_of_range;
  }
  return answer;
}